

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

void icu_63::number::impl::blueprint_helpers::parseMeasureUnitOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  undefined4 uVar1;
  char *__s1;
  UErrorCode UVar2;
  uint uVar3;
  int iVar4;
  char *__s2;
  undefined8 uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  UnicodeString *dest;
  UErrorCode localStatus;
  UnicodeString stemString;
  CharString subType;
  CharString type;
  MeasureUnit units [30];
  UErrorCode local_3fc;
  ConstChar16Ptr local_3f8;
  ConstChar16Ptr local_3f0;
  char16_t *local_3e8;
  char16_t *local_3d8;
  UnicodeString local_3c8;
  CharString local_388;
  CharString local_348;
  UnicodeString local_308 [11];
  
  numparse::impl::StringSegment::toTempUnicodeString(&local_3c8,segment);
  uVar1 = (int)local_3c8.fUnion.fStackFields.fLengthAndFlags >> 5;
  if (local_3c8.fUnion.fStackFields.fLengthAndFlags < 0) {
    uVar1 = local_3c8.fUnion.fFields.fLength;
  }
  if ((int)uVar1 < 1) {
    uVar6 = 0;
  }
  else {
    uVar5 = local_3c8.fUnion.fFields.fArray;
    if (((int)local_3c8.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
      uVar5 = local_3c8.fUnion.fStackFields.fBuffer;
    }
    uVar7 = 0;
    do {
      uVar6 = uVar7;
      if (*(char16_t *)(uVar5 + uVar7 * 2) == L'-') break;
      uVar7 = uVar7 + 1;
      uVar6 = (ulong)(uint)uVar1;
    } while ((uint)uVar1 != uVar7);
  }
  uVar3 = (uint)uVar6;
  if (uVar3 == uVar1) {
    *status = U_NUMBER_SKELETON_SYNTAX_ERROR;
  }
  else {
    MaybeStackArray<char,_40>::MaybeStackArray(&local_348.buffer);
    local_348.len = 0;
    *local_348.buffer.ptr = '\0';
    local_388.buffer.ptr._0_4_ = U_ZERO_ERROR;
    local_3f0.p_ = (char16_t *)0x0;
    if (((local_3c8.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) &&
       (local_3f0.p_ = local_3c8.fUnion.fFields.fArray,
       (local_3c8.fUnion.fStackFields.fLengthAndFlags & 2U) != 0)) {
      local_3f0.p_ = (char16_t *)((long)&local_3c8.fUnion + 2);
    }
    UnicodeString::UnicodeString(local_308,'\0',&local_3f0,uVar3);
    CharString::appendInvariantChars(&local_348,local_308,(UErrorCode *)&local_388);
    UnicodeString::~UnicodeString(local_308);
    local_3d8 = local_3f0.p_;
    UVar2 = U_NUMBER_SKELETON_SYNTAX_ERROR;
    if (((UErrorCode)local_388.buffer.ptr == U_INVARIANT_CONVERSION_ERROR) ||
       (UVar2 = (UErrorCode)local_388.buffer.ptr, U_ZERO_ERROR < (UErrorCode)local_388.buffer.ptr))
    {
      *status = UVar2;
    }
    else {
      MaybeStackArray<char,_40>::MaybeStackArray(&local_388.buffer);
      local_388.len = 0;
      *(undefined1 *)CONCAT44(local_388.buffer.ptr._4_4_,(UErrorCode)local_388.buffer.ptr) = 0;
      local_3fc = U_ZERO_ERROR;
      uVar5 = (char16_t *)0x0;
      if (((local_3c8.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) &&
         (uVar5 = local_3c8.fUnion.fFields.fArray,
         (local_3c8.fUnion.fStackFields.fLengthAndFlags & 2U) != 0)) {
        uVar5 = local_3c8.fUnion.fStackFields.fBuffer;
      }
      local_3f8.p_ = (char16_t *)(uVar5 + ((uVar6 & 0xffffffff) + 1) * 2);
      if (-1 < local_3c8.fUnion.fStackFields.fLengthAndFlags) {
        local_3c8.fUnion.fFields.fLength = (int)local_3c8.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      UnicodeString::UnicodeString
                (local_308,'\0',&local_3f8,~uVar3 + local_3c8.fUnion.fFields.fLength);
      CharString::appendInvariantChars(&local_388,local_308,&local_3fc);
      UnicodeString::~UnicodeString(local_308);
      local_3e8 = local_3f8.p_;
      UVar2 = U_NUMBER_SKELETON_SYNTAX_ERROR;
      if ((local_3fc == U_INVARIANT_CONVERSION_ERROR) ||
         (UVar2 = local_3fc, U_ZERO_ERROR < local_3fc)) {
        *status = UVar2;
      }
      else {
        lVar8 = 0;
        do {
          MeasureUnit::MeasureUnit
                    ((MeasureUnit *)
                     ((long)&local_308[0].super_Replaceable.super_UObject._vptr_UObject + lVar8));
          lVar8 = lVar8 + 0x18;
        } while (lVar8 != 0x2d0);
        local_3fc = U_ZERO_ERROR;
        dest = local_308;
        uVar3 = MeasureUnit::getAvailable(local_348.buffer.ptr,(MeasureUnit *)dest,0x1e,&local_3fc);
        UVar2 = U_INTERNAL_PROGRAM_ERROR;
        if ((local_3fc < U_ILLEGAL_ARGUMENT_ERROR) &&
           (UVar2 = U_NUMBER_SKELETON_SYNTAX_ERROR, 0 < (int)uVar3)) {
          uVar6 = (ulong)uVar3;
          do {
            __s1 = (char *)CONCAT44(local_388.buffer.ptr._4_4_,(UErrorCode)local_388.buffer.ptr);
            __s2 = MeasureUnit::getSubtype((MeasureUnit *)dest);
            iVar4 = strcmp(__s1,__s2);
            if (iVar4 == 0) {
              MeasureUnit::operator=(&macros->unit,(MeasureUnit *)dest);
              goto LAB_00276bbc;
            }
            dest = (UnicodeString *)((long)&dest->fUnion + 0x10);
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
        }
        *status = UVar2;
LAB_00276bbc:
        lVar8 = 0x2b8;
        do {
          MeasureUnit::~MeasureUnit
                    ((MeasureUnit *)
                     ((long)&local_308[0].super_Replaceable.super_UObject._vptr_UObject + lVar8));
          lVar8 = lVar8 + -0x18;
        } while (lVar8 != -0x18);
      }
      MaybeStackArray<char,_40>::~MaybeStackArray(&local_388.buffer);
    }
    MaybeStackArray<char,_40>::~MaybeStackArray(&local_348.buffer);
  }
  UnicodeString::~UnicodeString(&local_3c8);
  return;
}

Assistant:

void blueprint_helpers::parseMeasureUnitOption(const StringSegment& segment, MacroProps& macros,
                                               UErrorCode& status) {
    const UnicodeString stemString = segment.toTempUnicodeString();

    // NOTE: The category (type) of the unit is guaranteed to be a valid subtag (alphanumeric)
    // http://unicode.org/reports/tr35/#Validity_Data
    int firstHyphen = 0;
    while (firstHyphen < stemString.length() && stemString.charAt(firstHyphen) != '-') {
        firstHyphen++;
    }
    if (firstHyphen == stemString.length()) {
        // throw new SkeletonSyntaxException("Invalid measure unit option", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return;
    }

    // Need to do char <-> UChar conversion...
    U_ASSERT(U_SUCCESS(status));
    CharString type;
    SKELETON_UCHAR_TO_CHAR(type, stemString, 0, firstHyphen, status);
    CharString subType;
    SKELETON_UCHAR_TO_CHAR(subType, stemString, firstHyphen + 1, stemString.length(), status);

    // Note: the largest type as of this writing (March 2018) is "volume", which has 24 units.
    static constexpr int32_t CAPACITY = 30;
    MeasureUnit units[CAPACITY];
    UErrorCode localStatus = U_ZERO_ERROR;
    int32_t numUnits = MeasureUnit::getAvailable(type.data(), units, CAPACITY, localStatus);
    if (U_FAILURE(localStatus)) {
        // More than 30 units in this type?
        status = U_INTERNAL_PROGRAM_ERROR;
        return;
    }
    for (int32_t i = 0; i < numUnits; i++) {
        auto& unit = units[i];
        if (uprv_strcmp(subType.data(), unit.getSubtype()) == 0) {
            macros.unit = unit;
            return;
        }
    }

    // throw new SkeletonSyntaxException("Unknown measure unit", segment);
    status = U_NUMBER_SKELETON_SYNTAX_ERROR;
}